

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O2

void __thiscall event_track::DASHEventMessageBoxv1::print(DASHEventMessageBoxv1 *this)

{
  uchar *bytes_to_encode;
  ostream *poVar1;
  string local_30;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"== Event Message instance Box emsg v1 ==");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," reserved (timescale) ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," presentation_time: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," event_duration: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," id: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," scheme id uri: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->scheme_id_uri_);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," value:  ");
  poVar1 = std::operator<<(poVar1,(string *)&this->value_);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," message data b64: ");
  bytes_to_encode =
       (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  base64_encode_abi_cxx11_
            (&local_30,bytes_to_encode,
             (long)(this->message_data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)bytes_to_encode);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void print()
		{
			std::cout << "== Event Message instance Box emsg v1 ==" << std::endl;
			std::cout << " reserved (timescale) " << timescale_ << std::endl;
			std::cout << " presentation_time: " << presentation_time_ << std::endl;
			std::cout << " event_duration: " << event_duration_ << std::endl;
			std::cout << " id: " << id_ << std::endl;
			std::cout << " scheme id uri: " << scheme_id_uri_ << std::endl;
			std::cout << " value:  " << value_ << std::endl;
			std::cout << " message data b64: " << base64_encode(message_data_.data(), message_data_.size()) << std::endl;
		}